

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O0

REAL __thiscall TPZInterpolatedElement::MeanSolution(TPZInterpolatedElement *this,int var)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar4;
  TPZGeoEl *ref;
  REAL area;
  REAL meanvalue;
  REAL weight;
  TPZVec<double> intpoint;
  REAL detjac;
  TPZFMatrix<double> jacinv;
  TPZFMatrix<double> jacobian;
  TPZFMatrix<double> axes;
  int i;
  TPZManVector<double,_10> sol;
  TPZMaterial *material;
  int nvars;
  int dim;
  TPZManVector<double,_10> *in_stack_fffffffffffffd10;
  TPZCompEl *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  int iVar5;
  double *in_stack_fffffffffffffd30;
  TPZManVector<double,_10> *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  double dVar6;
  TPZFMatrix<double> *in_stack_fffffffffffffd50;
  double dVar7;
  double *in_stack_fffffffffffffd58;
  double dVar8;
  int64_t in_stack_fffffffffffffd60;
  int64_t in_stack_fffffffffffffd68;
  TPZFMatrix<double> *in_stack_fffffffffffffd70;
  double local_278;
  TPZFMatrix<double> *in_stack_fffffffffffffe08;
  REAL *in_stack_fffffffffffffe10;
  TPZFMatrix<double> *in_stack_fffffffffffffe18;
  TPZFMatrix<double> *in_stack_fffffffffffffe20;
  TPZVec<double> *in_stack_fffffffffffffe28;
  TPZGeoEl *in_stack_fffffffffffffe30;
  int local_a4;
  TPZVec<double> local_98 [3];
  long *local_28;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  double local_8;
  
  local_14 = in_ESI;
  local_18 = (**(code **)(*in_RDI + 0xb0))();
  local_28 = (long *)(**(code **)(*in_RDI + 0xb8))();
  if (local_28 == (long *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"REAL TPZInterpolatedElement::MeanSolution(int)")
    ;
    poVar2 = std::operator<<(poVar2," no material ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Meansolution no material");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = 0.0;
  }
  else {
    local_1c = (**(code **)(*local_28 + 0x88))(local_28,local_14);
    if (local_1c == 1) {
      TPZManVector<double,_10>::TPZManVector
                (in_stack_fffffffffffffd40,(int64_t)in_RDI,in_stack_fffffffffffffd30);
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (int64_t)in_stack_fffffffffffffd40);
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                 (int64_t)in_stack_fffffffffffffd40);
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (int64_t)in_stack_fffffffffffffd18,(double *)in_stack_fffffffffffffd10);
      dVar8 = 0.0;
      dVar7 = 0.0;
      dVar6 = 0.0;
      TPZCompEl::Reference(in_stack_fffffffffffffd18);
      local_a4 = 0;
      while( true ) {
        iVar5 = local_a4;
        plVar3 = (long *)(**(code **)(*in_RDI + 0x2c8))();
        iVar1 = (**(code **)(*plVar3 + 0x18))();
        if (iVar1 <= iVar5) break;
        plVar3 = (long *)(**(code **)(*in_RDI + 0x2c8))();
        (**(code **)(*plVar3 + 0x20))
                  (plVar3,local_a4,&stack0xfffffffffffffd68,&stack0xfffffffffffffd58);
        TPZGeoEl::Jacobian(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        (**(code **)(*in_RDI + 0x1b0))(in_RDI,&stack0xfffffffffffffd68,local_14,local_98);
        dVar6 = dVar8 * ABS(local_278) + dVar6;
        dVar4 = dVar8 * ABS(local_278);
        in_stack_fffffffffffffd10 =
             (TPZManVector<double,_10> *)TPZVec<double>::operator[](local_98,0);
        dVar7 = dVar4 * (double)(in_stack_fffffffffffffd10->super_TPZVec<double>)._vptr_TPZVec +
                dVar7;
        local_a4 = local_a4 + 1;
      }
      local_8 = dVar7 / dVar6;
      TPZVec<double>::~TPZVec(&in_stack_fffffffffffffd10->super_TPZVec<double>);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b049ef);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b049fc);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b04a09);
      TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffffd10);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Exiting MeanSolution: is not implemented to nvars != 1.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

REAL TPZInterpolatedElement::MeanSolution(int var) {
    int dim = Dimension(), nvars;
    TPZMaterial * material = Material();
    if (!material) {
        cout << __PRETTY_FUNCTION__ << " no material " << std::endl;
        LOGPZ_ERROR(logger, "Meansolution no material");
        return 0.;
    }

    nvars = material->NSolutionVariables(var);
    if (nvars != 1) {
        LOGPZ_ERROR(logger, "Exiting MeanSolution: is not implemented to nvars != 1.");
        return 0.;
    }
    TPZManVector<STATE> sol(nvars, 0.);

    int i;
    TPZFMatrix<REAL> axes(3, 3, 0.);
    TPZFMatrix<REAL> jacobian(dim, dim);
    TPZFMatrix<REAL> jacinv(dim, dim);
    REAL detjac;
    TPZVec<REAL> intpoint(dim, 0.);
    REAL weight = 0.;
    REAL meanvalue = 0.;
    REAL area = 0.;
    TPZGeoEl *ref = Reference();

    for (i = 0; i < GetIntegrationRule().NPoints(); i++) {
        GetIntegrationRule().Point(i, intpoint, weight);
        ref->Jacobian(intpoint, jacobian, axes, detjac, jacinv);

        /** Compute the solution value at point integration*/
        Solution(intpoint, var, sol);
        area += weight * fabs(detjac);
#ifdef STATE_COMPLEX
        meanvalue += (weight * fabs(detjac)) * sol[0].real(); //  meanvalue += (weight*fabs(detjac)*sol[j]);
#else
        meanvalue += (weight * fabs(detjac)) * sol[0];
#endif
    }
    return (meanvalue / area);
}